

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O2

void __thiscall HashUtil_Sha256ByteData_Test::TestBody(HashUtil_Sha256ByteData_Test *this)

{
  char *message;
  AssertHelper local_70;
  string local_68;
  AssertionResult gtest_ar;
  ByteData256 byte_data;
  ByteData target;
  
  std::__cxx11::string::string((string *)&local_68,"0123456789abcdef",(allocator *)&byte_data);
  cfd::core::ByteData::ByteData(&target,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  cfd::core::HashUtil::Sha256(&byte_data,&target);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_68,&byte_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"byte_data.GetHex().c_str()",
             "\"55c53f5d490297900cefa825d0c8e8e9532ee8a118abe7d8570762cd38be9818\"",
             local_68._M_dataplus._M_p,
             "55c53f5d490297900cefa825d0c8e8e9532ee8a118abe7d8570762cd38be9818");
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0xac,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&target);
  return;
}

Assistant:

TEST(HashUtil, Sha256ByteData) {
  ByteData target("0123456789abcdef");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "55c53f5d490297900cefa825d0c8e8e9532ee8a118abe7d8570762cd38be9818");
}